

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this,char code,bool ignore_zero)

{
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar1;
  int iVar2;
  int num_args;
  Impl *pIVar3;
  Impl *pIVar4;
  ExprBase EVar5;
  Reference RVar6;
  NumericExpr NVar7;
  undefined7 in_register_00000031;
  long lVar8;
  double dVar9;
  CallArgHandler CVar10;
  Impl *local_58;
  undefined8 uStack_50;
  ArgList local_40;
  
  iVar2 = (int)CONCAT71(in_register_00000031,code);
  switch(iVar2) {
  case 0x6c:
  case 0x6e:
  case 0x73:
    dVar9 = ReadConstant(this,code);
    if (dVar9 != 0.0 || !ignore_zero) {
      pBVar1 = this->handler_->builder_;
      local_58 = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar1->super_ExprFactory).exprs_,&local_58);
      pIVar3 = (Impl *)operator_new__(0x80);
      pIVar3->kind_ = FIRST_EXPR;
      (pBVar1->super_ExprFactory).exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar3;
      *(double *)(pIVar3 + 2) = dVar9;
      return (NumericExpr)pIVar3;
    }
    break;
  case 0x6f:
    iVar2 = ReadOpCode(this);
    NVar7 = ReadNumericExpr(this,iVar2);
    return (NumericExpr)NVar7.super_ExprBase.impl_;
  case 0x76:
    RVar6 = DoReadReference(this);
    return (NumericExpr)
           RVar6.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
  default:
    if (iVar2 == 0x66) {
      iVar2 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      num_args = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
      CVar10 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginCall
                         (this->handler_,iVar2,num_args);
      pIVar4 = CVar10.impl_;
      if (num_args < 1) {
        return (NumericExpr)pIVar4;
      }
      lVar8 = 0;
      do {
        EVar5.impl_ = (Impl *)ReadSymbolicExpr(this);
        pIVar4->args[CVar10.arg_index_ + lVar8] = EVar5.impl_;
        lVar8 = lVar8 + 1;
      } while (num_args != (int)lVar8);
      return (NumericExpr)pIVar4;
    }
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
    local_40.field_1.values_ = (Value *)&local_58;
    local_58 = (Impl *)0x0;
    uStack_50 = 0;
    local_40.types_ = 0;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x392020,&local_40);
  }
  return (NumericExpr)(Impl *)0x0;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}